

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

TypeVector * __thiscall wabt::Type::GetInlineVector(TypeVector *__return_storage_ptr__,Type *this)

{
  Enum EVar1;
  bool bVar2;
  allocator<wabt::Type> local_19;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  this_local = (Type *)__return_storage_ptr__;
  bVar2 = IsIndex(this);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsIndex()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/type.h",
                  0x72,"TypeVector wabt::Type::GetInlineVector() const");
  }
  EVar1 = this->enum_;
  if (EVar1 == Void) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(__return_storage_ptr__);
  }
  else {
    if (((EVar1 != Exnref) && (2 < (uint)(EVar1 + 0x12))) && (4 < (uint)(EVar1 + ~I8))) {
      abort();
    }
    std::allocator<wabt::Type>::allocator(&local_19);
    std::vector<wabt::Type,std::allocator<wabt::Type>>::vector<wabt::Type_const*,void>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)__return_storage_ptr__,this,this + 1
               ,&local_19);
    std::allocator<wabt::Type>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

TypeVector GetInlineVector() const {
    assert(!IsIndex());
    switch (enum_) {
      case Type::Void:
        return TypeVector();

      case Type::I32:
      case Type::I64:
      case Type::F32:
      case Type::F64:
      case Type::V128:
      case Type::Funcref:
      case Type::Anyref:
      case Type::Nullref:
      case Type::Exnref:
        return TypeVector(this, this + 1);

      default:
        WABT_UNREACHABLE;
    }
  }